

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
address_space_write_rom_sparc64(AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len)

{
  long lVar1;
  uint uVar2;
  MemoryRegion *pMVar3;
  uc_struct_conflict9 *uc;
  uint uVar4;
  uint uVar5;
  hwaddr l;
  hwaddr addr1;
  hwaddr local_40;
  uint local_38;
  undefined4 uStack_34;
  
  if (len != 0) {
    uc = (uc_struct_conflict9 *)as;
    do {
      local_40 = len;
      pMVar3 = flatview_translate_sparc64
                         (uc,as->current_map,addr,(hwaddr *)&local_38,&local_40,true,attrs);
      if (pMVar3->ram == false) {
        uVar5 = (pMVar3->ops->valid).max_access_size;
        uVar2 = 4;
        if (uVar5 != 0) {
          uVar2 = uVar5;
        }
        if ((pMVar3->ops->impl).unaligned == false) {
          uVar4 = -local_38 & local_38;
          uVar5 = uVar2;
          if (uVar4 <= uVar2) {
            uVar5 = uVar4;
          }
          if (uVar4 != 0) {
            uVar2 = uVar5;
          }
        }
        if (uVar2 < (uint)local_40) {
          local_40._0_4_ = uVar2;
        }
        lVar1 = 0x3f;
        if ((uint)local_40 != 0) {
          for (; (uint)local_40 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        if ((uint)local_40 == 0) {
          local_40 = 0;
        }
        else {
          local_40 = (hwaddr)(int)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
        }
      }
      else {
        uc = (uc_struct_conflict9 *)
             qemu_map_ram_ptr_sparc64
                       ((uc_struct_conflict9 *)as->uc,pMVar3->ram_block,CONCAT44(uStack_34,local_38)
                       );
        memcpy(uc,buf,local_40);
      }
      buf = (void *)((long)buf + local_40);
      addr = addr + local_40;
      len = len - local_40;
    } while (len != 0);
  }
  return 0;
}

Assistant:

static inline MemTxResult address_space_write_rom_internal(AddressSpace *as,
                                                           hwaddr addr,
                                                           MemTxAttrs attrs,
                                                           const void *ptr,
                                                           hwaddr len,
                                                           enum write_rom_type type)
{
    hwaddr l;
    uint8_t *ram_ptr;
    hwaddr addr1;
    MemoryRegion *mr;
    const uint8_t *buf = ptr;

    while (len > 0) {
        l = len;
        mr = address_space_translate(as, addr, &addr1, &l, true, attrs);

        if (!memory_region_is_ram(mr)) {
            l = memory_access_size(mr, l, addr1);
        } else {
            /* ROM/RAM case */
            ram_ptr = qemu_map_ram_ptr(as->uc, mr->ram_block, addr1);
            switch (type) {
            case WRITE_DATA:
                memcpy(ram_ptr, buf, l);
                break;
            case FLUSH_CACHE:
                flush_icache_range((uintptr_t)ram_ptr, (uintptr_t)ram_ptr + l);
                break;
            }
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return MEMTX_OK;
}